

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
Data(Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *this,
    Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *other)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  long in_RSI;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *in_RDI;
  long in_FS_OFFSET;
  R RVar4;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *newNode;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  (in_RDI->value).x.x = *(vec2 *)(in_RSI + 8);
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  (in_RDI->value).x.A.a = (float)(int)uVar1;
  (in_RDI->value).x.A.b = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  (in_RDI->value).x.A.c = (float)(int)uVar1;
  (in_RDI->value).x.A.d = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->value).x.P.a = 0.0;
  (in_RDI->value).x.P.b = 0.0;
  RVar4 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar4.spans;
  *(Span **)&(in_RDI->value).x.P = local_28;
  local_20 = RVar4.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar2 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar3 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
              hasNode((Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                       *)(lVar2 + local_48 * 0x90),local_58);
      if (bVar3) {
        Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::at
                  ((Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                    *)this_00,(size_t)in_RDI);
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)&(this_00->value).x.P + local_48 * 0x90),local_58
                      );
        Bucket::insert((Bucket *)0x1257fb);
        Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::Node(this_00,in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }